

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleBasedTimeZone::operator==(RuleBasedTimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  RuleBasedTimeZone *rbtz;
  TimeZone *that_local;
  RuleBasedTimeZone *this_local;
  
  if (this == (RuleBasedTimeZone *)that) {
    return '\x01';
  }
  if (this == (RuleBasedTimeZone *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator!=
                    ((type_info *)
                     (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if ((bVar1) || (UVar2 = TimeZone::operator==((TimeZone *)this,that), UVar2 == '\0')) {
    return '\0';
  }
  iVar3 = (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[5])
                    (this->fInitialRule,that[1].super_UObject._vptr_UObject);
  if ((char)iVar3 != '\0') {
    return '\0';
  }
  UVar2 = compareRules(this->fHistoricRules,
                       (UVector *)that[1].fID.super_Replaceable.super_UObject._vptr_UObject);
  if ((UVar2 != '\0') &&
     (UVar2 = compareRules(this->fFinalRules,*(UVector **)&that[1].fID.fUnion), UVar2 != '\0')) {
    return '\x01';
  }
  return '\0';
}

Assistant:

UBool
RuleBasedTimeZone::operator==(const TimeZone& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)
        || BasicTimeZone::operator==(that) == FALSE) {
        return FALSE;
    }
    RuleBasedTimeZone *rbtz = (RuleBasedTimeZone*)&that;
    if (*fInitialRule != *(rbtz->fInitialRule)) {
        return FALSE;
    }
    if (compareRules(fHistoricRules, rbtz->fHistoricRules)
        && compareRules(fFinalRules, rbtz->fFinalRules)) {
        return TRUE;
    }
    return FALSE;
}